

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O1

char * __thiscall cmCPackGenerator::GetOption(cmCPackGenerator *this,string *op)

{
  cmCPackLog *this_00;
  char *pcVar1;
  ostream *poVar2;
  size_t length;
  ostringstream cmCPackLog_msg;
  long *local_1b8;
  long local_1a8 [2];
  undefined1 local_198 [376];
  
  pcVar1 = cmMakefile::GetDefinition(this->MakefileMap,op);
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Warning, GetOption return NULL for: ",0x24);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(op->_M_dataplus)._M_p,op->_M_string_length);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    this_00 = this->Logger;
    std::__cxx11::stringbuf::str();
    length = strlen((char *)local_1b8);
    cmCPackLog::Log(this_00,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x4c3,(char *)local_1b8,length);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  }
  return pcVar1;
}

Assistant:

const char* cmCPackGenerator::GetOption(const std::string& op) const
{
  const char* ret = this->MakefileMap->GetDefinition(op);
  if(!ret)
    {
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "Warning, GetOption return NULL for: "
                  << op
                  << std::endl);
    }
  return ret;
}